

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqobject.cpp
# Opt level: O0

void __thiscall SQVM::Mark(SQVM *this,SQCollectable **chain)

{
  SQUnsignedInteger SVar1;
  SQObjectPtr *o;
  long local_28;
  SQInteger k;
  SQUnsignedInteger i;
  SQCollectable **chain_local;
  SQVM *this_local;
  
  if (((this->super_SQCollectable).super_SQRefCounted._uiRef & 0x80000000) == 0) {
    (this->super_SQCollectable).super_SQRefCounted._uiRef =
         (this->super_SQCollectable).super_SQRefCounted._uiRef | 0x80000000;
    SQSharedState::MarkObject(&this->_lasterror,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_errorhandler,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_debughook_closure,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->_roottable,(SQCollectable_conflict **)chain);
    SQSharedState::MarkObject(&this->temp_reg,(SQCollectable_conflict **)chain);
    k = 0;
    while( true ) {
      SVar1 = sqvector<SQObjectPtr>::size(&this->_stack);
      if (SVar1 <= (ulong)k) break;
      o = sqvector<SQObjectPtr>::operator[](&this->_stack,k);
      SQSharedState::MarkObject(o,(SQCollectable_conflict **)chain);
      k = k + 1;
    }
    for (local_28 = 0; local_28 < this->_callsstacksize; local_28 = local_28 + 1) {
      SQSharedState::MarkObject
                (&this->_callsstack[local_28]._closure,(SQCollectable_conflict **)chain);
    }
    SQCollectable::RemoveFromChain(&this->_sharedstate->_gc_chain,(SQCollectable_conflict *)this);
    SQCollectable::AddToChain((SQCollectable_conflict **)chain,(SQCollectable_conflict *)this);
  }
  return;
}

Assistant:

void SQVM::Mark(SQCollectable **chain)
{
    START_MARK()
        SQSharedState::MarkObject(_lasterror,chain);
        SQSharedState::MarkObject(_errorhandler,chain);
        SQSharedState::MarkObject(_debughook_closure,chain);
        SQSharedState::MarkObject(_roottable, chain);
        SQSharedState::MarkObject(temp_reg, chain);
        for(SQUnsignedInteger i = 0; i < _stack.size(); i++) SQSharedState::MarkObject(_stack[i], chain);
        for(SQInteger k = 0; k < _callsstacksize; k++) SQSharedState::MarkObject(_callsstack[k]._closure, chain);
    END_MARK()
}